

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_handle.c
# Opt level: O0

log_record log_handle_push(log_handle handle,log_record_ctor record_ctor)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  log_record plVar4;
  long *in_RDI;
  void *dest;
  void *buffer;
  size_t new_size;
  log_record_ctor in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  log_handle in_stack_ffffffffffffffd8;
  
  if (in_RDI[1] + 1 == in_RDI[2]) {
    lVar1 = in_RDI[2];
    in_stack_ffffffffffffffd8 = (log_handle)realloc((void *)*in_RDI,lVar1 << 1);
    if (in_stack_ffffffffffffffd8 == (log_handle)0x0) {
      return (log_record)0x0;
    }
    *in_RDI = (long)in_stack_ffffffffffffffd8;
    in_RDI[2] = lVar1 << 1;
  }
  if (in_RDI[1] != 0) {
    lVar1 = *in_RDI;
    sVar2 = log_record_size();
    in_stack_ffffffffffffffc8 = (log_record_ctor)*in_RDI;
    in_stack_ffffffffffffffd0 = (void *)(lVar1 + sVar2);
    sVar3 = log_record_size();
    memmove((void *)(lVar1 + sVar2),in_stack_ffffffffffffffc8,sVar3 * in_RDI[1]);
  }
  in_RDI[1] = in_RDI[1] + 1;
  plVar4 = log_handle_set(in_stack_ffffffffffffffd8,(size_t)in_stack_ffffffffffffffd0,
                          in_stack_ffffffffffffffc8);
  return plVar4;
}

Assistant:

log_record log_handle_push(log_handle handle, const log_record_ctor record_ctor)
{
	if ((handle->count + 1) == handle->size)
	{
		const size_t new_size = handle->size << 0x01;

		register void *buffer = realloc(handle->buffer, new_size);

		if (buffer == NULL)
		{
			return NULL;
		}

		handle->buffer = buffer;

		handle->size = new_size;
	}

	if (handle->count > 0)
	{
		void *dest = (unsigned char *)(handle->buffer) + log_record_size();

		memmove(dest, handle->buffer, log_record_size() * handle->count);
	}

	++handle->count;

	return log_handle_set(handle, 0, record_ctor);
}